

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

NodeData __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::DFS(SCCAnalyzer *this,Descriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
  *this_00;
  pointer *pppDVar2;
  iterator iVar3;
  vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
  *this_01;
  int iVar4;
  _Base_ptr p_Var5;
  LogMessage *other;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  int iVar8;
  _Rb_tree_header *p_Var9;
  long lVar10;
  _Base_ptr p_Var11;
  NodeData NVar12;
  Descriptor *child;
  Descriptor *local_78;
  Descriptor *local_70;
  LogMessage local_68;
  
  p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var11 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var11 != (_Base_ptr)0x0;
      p_Var11 = (&p_Var11->_M_left)[*(Descriptor **)(p_Var11 + 1) < descriptor]) {
    if (*(Descriptor **)(p_Var11 + 1) >= descriptor) {
      p_Var5 = p_Var11;
    }
  }
  p_Var11 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var11 = p_Var5, descriptor < *(Descriptor **)(p_Var5 + 1))) {
    p_Var11 = &p_Var1->_M_header;
  }
  local_78 = descriptor;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x29b);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (cache_.count(descriptor)) == (0): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  this_00 = &this->cache_;
  pmVar6 = std::
           map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
           ::operator[](this_00,&local_78);
  iVar4 = this->index_;
  this->index_ = iVar4 + 1;
  pmVar6->lowlink = iVar4;
  pmVar6->index = iVar4;
  iVar3._M_current =
       (this->stack_).
       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->stack_).
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
    ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
              ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                *)&this->stack_,iVar3,&local_78);
  }
  else {
    *iVar3._M_current = local_78;
    pppDVar2 = &(this->stack_).
                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar2 = *pppDVar2 + 1;
  }
  if (0 < *(int *)(local_78 + 0x2c)) {
    lVar10 = 0;
    do {
      local_70 = FieldDescriptor::message_type
                           ((FieldDescriptor *)(lVar10 * 0xa8 + *(long *)(local_78 + 0x30)));
      if (local_70 != (Descriptor *)0x0) {
        p_Var11 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = &p_Var1->_M_header;
        for (; (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
            p_Var11 = (&p_Var11->_M_left)[*(Descriptor **)(p_Var11 + 1) < local_70]) {
          if (*(Descriptor **)(p_Var11 + 1) >= local_70) {
            p_Var5 = p_Var11;
          }
        }
        p_Var9 = p_Var1;
        if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
           (p_Var9 = (_Rb_tree_header *)p_Var5,
           local_70 < (Descriptor *)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
          p_Var9 = p_Var1;
        }
        if (p_Var9 == p_Var1) {
          NVar12 = DFS(this,local_70);
          iVar8 = NVar12.lowlink;
          iVar4 = pmVar6->lowlink;
        }
        else {
          pmVar7 = std::
                   map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
                   ::operator[](this_00,&local_70);
          if (pmVar7->scc != (SCC *)0x0) goto LAB_00210da1;
          iVar4 = pmVar7->index;
          iVar8 = pmVar6->lowlink;
        }
        if (iVar4 < iVar8) {
          iVar8 = iVar4;
        }
        pmVar6->lowlink = iVar8;
      }
LAB_00210da1:
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(local_78 + 0x2c));
  }
  if (pmVar6->index == pmVar6->lowlink) {
    local_70 = (Descriptor *)operator_new(0x18);
    *(undefined8 *)local_70 = 0;
    *(undefined8 *)(local_70 + 8) = 0;
    *(undefined8 *)(local_70 + 0x10) = 0;
    std::
    vector<google::protobuf::compiler::cpp::SCC*,std::allocator<google::protobuf::compiler::cpp::SCC*>>
    ::emplace_back<google::protobuf::compiler::cpp::SCC*>
              ((vector<google::protobuf::compiler::cpp::SCC*,std::allocator<google::protobuf::compiler::cpp::SCC*>>
                *)&this->garbage_bin_,(SCC **)&local_70);
    this_01 = (vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
               *)(this->garbage_bin_).
                 super__Vector_base<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
    do {
      local_70 = (this->stack_).
                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
      iVar3._M_current = *(Descriptor ***)(this_01 + 8);
      if (iVar3._M_current == *(Descriptor ***)(this_01 + 0x10)) {
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>(this_01,iVar3,&local_70);
      }
      else {
        *iVar3._M_current = local_70;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
      pppDVar2 = &(this->stack_).
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar2 = *pppDVar2 + -1;
      pmVar7 = std::
               map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
               ::operator[](this_00,&local_70);
      pmVar7->scc = (SCC *)this_01;
    } while (local_70 != local_78);
  }
  NVar12.scc = pmVar6->scc;
  NVar12.index = pmVar6->index;
  NVar12.lowlink = pmVar6->lowlink;
  return NVar12;
}

Assistant:

SCCAnalyzer::NodeData SCCAnalyzer::DFS(const Descriptor* descriptor) {
  // Must not have visited already.
  GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

  // Mark visited by inserting in map.
  NodeData& result = cache_[descriptor];
  // Initialize data structures.
  result.index = result.lowlink = index_++;
  stack_.push_back(descriptor);

  // Recurse the fields / nodes in graph
  for (int i = 0; i < descriptor->field_count(); i++) {
    const Descriptor* child = descriptor->field(i)->message_type();
    if (child) {
      if (cache_.count(child) == 0) {
        // unexplored node
        NodeData child_data = DFS(child);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[child];
        if (child_data.scc == NULL) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
  }
  if (result.index == result.lowlink) {
    // This is the root of a strongly connected component
    SCC* scc = CreateSCC();
    while (true) {
      const Descriptor* scc_desc = stack_.back();
      scc->descriptors.push_back(scc_desc);
      // Remove from stack
      stack_.pop_back();
      cache_[scc_desc].scc = scc;

      if (scc_desc == descriptor) break;
    }
  }
  return result;
}